

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void inv_shift_rows(uint32_t *state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t y;
  uint32_t x;
  uint32_t v;
  uint32_t u;
  uint32_t *state_local;
  
  uVar1 = *state;
  uVar2 = state[1];
  uVar3 = *state;
  uVar4 = state[2];
  uVar5 = state[1];
  uVar6 = *state;
  *state = *state & 0xff000000 | (state[3] >> 0x10 & 0xff) << 0x10 | (state[2] >> 8 & 0xff) << 8 |
           state[1] & 0xff;
  state[1] = state[1] & 0xff000000 | (uVar1 >> 0x10 & 0xff) << 0x10 | (state[3] >> 8 & 0xff) << 8 |
             state[2] & 0xff;
  state[2] = state[2] & 0xff000000 | (uVar2 >> 0x10 & 0xff) << 0x10 | (uVar3 >> 8 & 0xff) << 8 |
             state[3] & 0xff;
  state[3] = state[3] & 0xff000000 | (uVar4 >> 0x10 & 0xff) << 0x10 | (uVar5 >> 8 & 0xff) << 8 |
             uVar6 & 0xff;
  return;
}

Assistant:

static void inv_shift_rows(uint32_t state[4])
{
  uint32_t u, v, x, y;

  u = word4(byte(state[0], 0),
            byte(state[3], 1),
            byte(state[2], 2),
            byte(state[1], 3));

  v = word4(byte(state[1], 0),
            byte(state[0], 1),
            byte(state[3], 2),
            byte(state[2], 3));

  x = word4(byte(state[2], 0),
            byte(state[1], 1),
            byte(state[0], 2),
            byte(state[3], 3));

  y = word4(byte(state[3], 0),
            byte(state[2], 1),
            byte(state[1], 2),
            byte(state[0], 3));

  state[0] = u;
  state[1] = v;
  state[2] = x;
  state[3] = y;
}